

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<char>::setCapacity(Vector<char> *this,size_t newSize)

{
  char *pcVar1;
  char *pcVar2;
  RemoveConst<char> *pRVar3;
  char *__dest;
  size_t __n;
  ArrayBuilder<char> newBuilder;
  ArrayBuilder<char> local_38;
  
  pcVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pcVar1)) {
    (this->builder).pos = pcVar1 + newSize;
  }
  __dest = (char *)_::HeapArrayDisposer::allocateImpl
                             (1,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar1 = (this->builder).ptr;
  pcVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (pcVar1 != pcVar2) {
    __n = (long)pcVar2 - (long)pcVar1;
    local_38.pos = __dest;
    memcpy(__dest,pcVar1,__n);
    __dest = __dest + __n;
  }
  local_38.pos = __dest;
  ArrayBuilder<char>::operator=(&this->builder,&local_38);
  pcVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pcVar1 = local_38.ptr;
  if (local_38.ptr != (char *)0x0) {
    local_38.ptr = (char *)0x0;
    local_38.pos = (RemoveConst<char> *)0x0;
    local_38.endPtr = (char *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pcVar1,1,(long)pRVar3 - (long)pcVar1,(long)pcVar2 - (long)pcVar1,0)
    ;
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }